

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowererMDArch.cpp
# Opt level: O1

Instr * __thiscall LowererMDArch::LoadStackArgPtr(LowererMDArch *this,Instr *instrArgPtr)

{
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  RegOpnd *optionalDstOpnd;
  undefined4 *puVar4;
  Instr *pIVar5;
  
  optionalDstOpnd = (RegOpnd *)IR::Instr::UnlinkDst(instrArgPtr);
  OVar2 = IR::Opnd::GetKind((Opnd *)optionalDstOpnd);
  if (OVar2 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pIVar5 = LoadInputParamPtr(this,instrArgPtr,optionalDstOpnd);
  IR::Instr::Remove(instrArgPtr);
  return pIVar5->m_prev;
}

Assistant:

IR::Instr *
LowererMDArch::LoadStackArgPtr(IR::Instr * instrArgPtr)
{
    // Get the args pointer relative to the frame pointer.
    // NOTE: This code is sufficient for the apply-args optimization, but not for StackArguments,
    // if and when that is enabled.

    // dst = LEA &[rbp + "this" offset + sizeof(var)]

    IR::Instr * instr = LoadInputParamPtr(instrArgPtr, instrArgPtr->UnlinkDst()->AsRegOpnd());
    instrArgPtr->Remove();

    return instr->m_prev;
}